

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

void __thiscall
wasm::
WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>_>
::run(WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>_>
      *this,Module *module)

{
  PostWalker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
  *this_00;
  PassRunner *pPVar1;
  pointer puVar2;
  Global *pGVar3;
  pointer puVar4;
  Function *pFVar5;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> uVar6;
  undefined8 *puVar7;
  pointer puVar8;
  DataSegment *pDVar9;
  int iVar10;
  undefined8 *puVar11;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_2;
  __hashtable_alloc *p_Var12;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar13;
  pointer puVar14;
  pointer puVar15;
  undefined1 local_2d0 [8];
  PassRunner runner;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_190;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_158;
  element_type *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a8;
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_58;
  __alloc_node_gen_t __alloc_node_gen_2;
  _Head_base<0UL,_wasm::Pass_*,_false> local_38;
  
  if ((this->super_Pass).runner == (PassRunner *)0x0) {
    __assert_fail("getPassRunner()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                  ,500,
                  "virtual void wasm::WalkerPass<wasm::PostWalker<wasm::(anonymous namespace)::GlobalUseScanner>>::run(Module *) [WalkerType = wasm::PostWalker<wasm::(anonymous namespace)::GlobalUseScanner>]"
                 );
  }
  iVar10 = (*(this->super_Pass)._vptr_Pass[4])();
  if ((char)iVar10 == '\0') {
    this_00 = &this->
               super_PostWalker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
    ;
    (this->
    super_PostWalker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
    ).
    super_Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
    .currModule = module;
    puVar2 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar13 = (module->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar2;
        puVar13 = puVar13 + 1) {
      pGVar3 = (puVar13->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if ((pGVar3->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
        ::walk(&this_00->
                super_Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
               ,&pGVar3->init);
      }
    }
    puVar4 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar14 = (module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar4;
        puVar14 = puVar14 + 1) {
      pFVar5 = (puVar14->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if ((pFVar5->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        (this->
        super_PostWalker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
        ).
        super_Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
        .currFunction = pFVar5;
        Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
        ::walk(&this_00->
                super_Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
               ,&pFVar5->body);
        anon_unknown_224::GlobalUseScanner::visitFunction
                  ((GlobalUseScanner *)this,(Function *)pFVar5->body);
        (this->
        super_PostWalker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
        ).
        super_Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
        .currFunction = (Function *)0x0;
      }
      else {
        anon_unknown_224::GlobalUseScanner::visitFunction
                  ((GlobalUseScanner *)this,(Function *)pFVar5->body);
      }
    }
    p_Var12 = (__hashtable_alloc *)
              (module->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __alloc_node_gen_2._M_h =
         (__hashtable_alloc *)
         (module->elementSegments).
         super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var12 != __alloc_node_gen_2._M_h) {
      do {
        uVar6._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
             *(__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
               *)p_Var12;
        if (*(long *)((long)uVar6._M_t.
                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                     0x20) != 0) {
          Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
          ::walk(&this_00->
                  super_Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
                 ,(Expression **)
                  ((long)uVar6._M_t.
                         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x28))
          ;
        }
        puVar7 = *(undefined8 **)
                  ((long)uVar6._M_t.
                         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x40);
        for (puVar11 = *(undefined8 **)
                        ((long)uVar6._M_t.
                               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                        0x38); puVar11 != puVar7; puVar11 = puVar11 + 1) {
          local_2d0 = (undefined1  [8])*puVar11;
          Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
          ::walk(&this_00->
                  super_Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
                 ,(Expression **)local_2d0);
        }
        p_Var12 = p_Var12 + 8;
      } while (p_Var12 != __alloc_node_gen_2._M_h);
    }
    puVar8 = (module->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar15 = (module->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar8;
        puVar15 = puVar15 + 1) {
      pDVar9 = (puVar15->_M_t).
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar9->isPassive == false) {
        Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
        ::walk(&this_00->
                super_Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
               ,&pDVar9->offset);
      }
    }
    (this->
    super_PostWalker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
    ).
    super_Walker<wasm::(anonymous_namespace)::GlobalUseScanner,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseScanner,_void>_>
    .currModule = (Module *)0x0;
  }
  else {
    pPVar1 = (this->super_Pass).runner;
    local_e8._0_1_ = (pPVar1->options).ignoreImplicitTraps;
    local_e8._1_1_ = (pPVar1->options).trapsNeverHappen;
    local_e8._2_1_ = (pPVar1->options).lowMemoryUnused;
    local_e8._3_1_ = (pPVar1->options).fastMath;
    local_e8._4_1_ = (pPVar1->options).zeroFilledMemory;
    local_e8._5_1_ = (pPVar1->options).closedWorld;
    local_e8._6_1_ = (pPVar1->options).debugInfo;
    local_e8._7_1_ = (pPVar1->options).targetJS;
    local_108._0_1_ = (pPVar1->options).debug;
    local_108._1_1_ = (pPVar1->options).validate;
    local_108._2_1_ = (pPVar1->options).validateGlobally;
    local_108._3_1_ = (pPVar1->options).field_0x3;
    local_108._4_4_ = (pPVar1->options).optimizeLevel;
    uStack_100._0_4_ = (pPVar1->options).shrinkLevel;
    uStack_100._4_4_ = (pPVar1->options).inlining.alwaysInlineMaxSize;
    local_f8._0_4_ = (pPVar1->options).inlining.oneCallerInlineMaxSize;
    local_f8._4_4_ = (pPVar1->options).inlining.flexibleInlineMaxSize;
    uStack_f0._0_1_ = (pPVar1->options).inlining.allowFunctionsWithLoops;
    uStack_f0._1_3_ = *(undefined3 *)&(pPVar1->options).inlining.field_0xd;
    uStack_f0._4_4_ = (pPVar1->options).inlining.partialInliningIfs;
    local_e0._M_buckets = (__buckets_ptr)0x0;
    local_e0._M_bucket_count = (pPVar1->options).arguments._M_h._M_bucket_count;
    local_e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_e0._M_element_count = (pPVar1->options).arguments._M_h._M_element_count;
    local_e0._M_rehash_policy._M_max_load_factor =
         (pPVar1->options).arguments._M_h._M_rehash_policy._M_max_load_factor;
    local_e0._M_rehash_policy._4_4_ =
         *(undefined4 *)&(pPVar1->options).arguments._M_h._M_rehash_policy.field_0x4;
    local_e0._M_rehash_policy._M_next_resize =
         (pPVar1->options).arguments._M_h._M_rehash_policy._M_next_resize;
    local_e0._M_single_bucket = (__node_base_ptr)0x0;
    local_2d0 = (undefined1  [8])&local_e0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_e0,&(pPVar1->options).arguments._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                *)local_2d0);
    local_a8._M_buckets = (__buckets_ptr)0x0;
    local_a8._M_bucket_count = (pPVar1->options).passesToSkip._M_h._M_bucket_count;
    local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_a8._M_element_count = (pPVar1->options).passesToSkip._M_h._M_element_count;
    local_a8._M_rehash_policy._M_max_load_factor =
         (pPVar1->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor;
    local_a8._M_rehash_policy._4_4_ =
         *(undefined4 *)&(pPVar1->options).passesToSkip._M_h._M_rehash_policy.field_0x4;
    local_a8._M_rehash_policy._M_next_resize =
         (pPVar1->options).passesToSkip._M_h._M_rehash_policy._M_next_resize;
    local_a8._M_single_bucket = (__node_base_ptr)0x0;
    local_2d0 = (undefined1  [8])&local_a8;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&local_a8,&(pPVar1->options).passesToSkip._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                *)local_2d0);
    local_70 = (pPVar1->options).funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_68 = (pPVar1->options).funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_68->_M_use_count = local_68->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_68->_M_use_count = local_68->_M_use_count + 1;
      }
    }
    local_108 = (__node_base_ptr)
                CONCAT44(~-(uint)((int)local_108._4_4_ < 1) & 1 |
                         local_108._4_4_ & -(uint)((int)local_108._4_4_ < 1),(undefined4)local_108);
    uStack_100 = CONCAT44(uStack_100._4_4_,
                          ~-(uint)((int)(uint)uStack_100 < 1) & 1 |
                          (uint)uStack_100 & -(uint)((int)(uint)uStack_100 < 1));
    runner.skippedPasses._M_h._M_single_bucket = local_108;
    local_190._M_buckets = (__buckets_ptr)0x0;
    local_190._M_bucket_count = local_e0._M_bucket_count;
    local_190._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_190._M_element_count = local_e0._M_element_count;
    local_190._M_rehash_policy._M_max_load_factor = local_e0._M_rehash_policy._M_max_load_factor;
    local_190._M_rehash_policy._4_4_ = local_e0._M_rehash_policy._4_4_;
    local_190._M_rehash_policy._M_next_resize = local_e0._M_rehash_policy._M_next_resize;
    local_190._M_single_bucket = (__node_base_ptr)0x0;
    local_58._M_h = (__hashtable_alloc *)&local_190;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_190,&local_e0,&local_58);
    local_158._M_buckets = (__buckets_ptr)0x0;
    local_158._M_bucket_count = local_a8._M_bucket_count;
    local_158._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_158._M_element_count = local_a8._M_element_count;
    local_158._M_rehash_policy._M_max_load_factor = local_a8._M_rehash_policy._M_max_load_factor;
    local_158._M_rehash_policy._4_4_ = local_a8._M_rehash_policy._4_4_;
    local_158._M_rehash_policy._M_next_resize = local_a8._M_rehash_policy._M_next_resize;
    local_158._M_single_bucket = (__node_base_ptr)0x0;
    local_58._M_h = (__hashtable_alloc *)&local_158;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&local_158,&local_a8,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                *)&local_58);
    local_120 = local_70;
    local_118 = local_68;
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_68->_M_use_count = local_68->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_68->_M_use_count = local_68->_M_use_count + 1;
      }
    }
    PassRunner::PassRunner
              ((PassRunner *)local_2d0,module,
               (PassOptions *)&runner.skippedPasses._M_h._M_single_bucket);
    if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_158);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_190);
    runner.options.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_1_ = 1;
    (*(this->super_Pass)._vptr_Pass[5])(&local_38);
    PassRunner::add((PassRunner *)local_2d0,
                    (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_38);
    if (local_38._M_head_impl != (Pass *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Pass[1])();
    }
    local_38._M_head_impl = (Pass *)0x0;
    PassRunner::run((PassRunner *)local_2d0);
    PassRunner::~PassRunner((PassRunner *)local_2d0);
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_a8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_e0);
  }
  return;
}

Assistant:

void run(Module* module) override {
    assert(getPassRunner());
    // Parallel pass running is implemented in the PassRunner.
    if (isFunctionParallel()) {
      // Reduce opt/shrink levels to a maximum of one in nested runners like
      // these, to balance runtime. We definitely want the full levels in the
      // main passes we run, but nested pass runners are of secondary
      // importance.
      // TODO Investigate the impact of allowing the levels to just pass
      //      through. That seems to cause at least some regression in compile
      //      times in -O3, however, but with careful measurement we may find
      //      the benefits are worth it. For now -O1 is a reasonable compromise
      //      as it has basically linear runtime, unlike -O2 and -O3.
      auto options = getPassOptions();
      options.optimizeLevel = std::min(options.optimizeLevel, 1);
      options.shrinkLevel = std::min(options.shrinkLevel, 1);
      PassRunner runner(module, options);
      runner.setIsNested(true);
      runner.add(create());
      runner.run();
      return;
    }
    // Single-thread running just calls the walkModule traversal.
    WalkerType::walkModule(module);
  }